

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testInit
          (UniformBlockMemberAlignNonPowerOf2Test *this)

{
  pointer *pptVar1;
  iterator __position;
  int iVar2;
  UniformBlockMemberAlignNonPowerOf2Test *this_00;
  bool bVar3;
  GLuint stage;
  long lVar4;
  GLuint align;
  uint uVar5;
  Type TVar6;
  bool stage_support [6];
  testCase local_60;
  char acStack_46 [6];
  ulong local_40;
  UniformBlockMemberAlignNonPowerOf2Test *local_38;
  
  lVar4 = 0;
  do {
    this_00 = this;
    iVar2 = (*(this->super_NegativeTestBase).super_TestBase.super_TestCase.super_TestCase.
              super_TestNode._vptr_TestNode[0xc])();
    acStack_46[lVar4] = (char)iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_38 = (UniformBlockMemberAlignNonPowerOf2Test *)&this->m_test_cases;
  local_40 = 0;
  do {
    TVar6 = TestBase::getType((TestBase *)this_00,(GLuint)local_40);
    uVar5 = 0;
    do {
      bVar3 = uVar5 == 0 || (uVar5 & uVar5 - 1) != 0;
      lVar4 = 0;
      do {
        if (acStack_46[lVar4] != '\0') {
          local_60.m_type.m_basic_type = TVar6.m_basic_type;
          local_60.m_type._4_8_ = TVar6._4_8_;
          local_60.m_should_fail = bVar3;
          local_60.m_stage = (STAGES)lVar4;
          __position._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_60.m_alignment = uVar5;
          if (__position._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_00 = local_38;
            std::
            vector<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>>
            ::
            _M_realloc_insert<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>>
                        *)local_38,__position,&local_60);
          }
          else {
            (__position._M_current)->m_should_fail = bVar3;
            *(undefined3 *)&(__position._M_current)->field_0x11 = local_60._17_3_;
            (__position._M_current)->m_stage = local_60.m_stage;
            (__position._M_current)->m_alignment = uVar5;
            ((__position._M_current)->m_type).m_basic_type = local_60.m_type.m_basic_type;
            ((__position._M_current)->m_type).m_n_columns = local_60.m_type.m_n_columns;
            ((__position._M_current)->m_type).m_n_rows = local_60.m_type.m_n_rows;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase,_std::allocator<gl4cts::EnhancedLayouts::UniformBlockMemberAlignNonPowerOf2Test::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x81);
    uVar5 = (int)local_40 + 1;
    local_40 = (ulong)uVar5;
  } while (uVar5 != 0x22);
  return;
}

Assistant:

void UniformBlockMemberAlignNonPowerOf2Test::testInit()
{
	static const GLuint dmat4_size = 128;
	const GLuint		n_types	= getTypesNumber();
	bool				stage_support[Utils::Shader::STAGE_MAX];

	for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
	{
		stage_support[stage] = isStageSupported((Utils::Shader::STAGES)stage);
	}

	for (GLuint j = 0; j < n_types; ++j)
	{
		const Utils::Type& type = getType(j);

		for (GLuint align = 0; align <= dmat4_size; ++align)
		{

#if WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST

			const bool should_fail = (0 == align) ? false : !isPowerOf2(align);

#else /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			const bool should_fail = !isPowerOf2(align);

#endif /* WRKARD_UNIFORMBLOCKMEMBERALIGNNONPOWEROF2TEST */

			for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
			{
				if (false == stage_support[stage])
				{
					continue;
				}

				testCase test_case = { align, type, should_fail, (Utils::Shader::STAGES)stage };

				m_test_cases.push_back(test_case);
			}
		}
	}
}